

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

bool __thiscall ExecutorRegVm::RemoveBreakpoint(ExecutorRegVm *this,uint instruction)

{
  uint uVar1;
  RegVmCmd *pRVar2;
  RegVmCmd *pRVar3;
  uint instruction_local;
  ExecutorRegVm *this_local;
  
  uVar1 = FastVector<RegVmCmd,_false,_false>::size(&this->exLinker->exRegVmCode);
  if (uVar1 < instruction) {
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
    this->execErrorMessage = this->execErrorBuffer;
    this_local._7_1_ = false;
  }
  else {
    pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                       (&this->exLinker->exRegVmCode,instruction);
    if (pRVar2->code == '\0') {
      pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                         (&this->exLinker->exRegVmCode,instruction);
      pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->breakCode,pRVar2->argument);
      pRVar3 = FastVector<RegVmCmd,_false,_false>::operator[]
                         (&this->exLinker->exRegVmCode,instruction);
      *pRVar3 = *pRVar2;
      this_local._7_1_ = true;
    }
    else {
      NULLC::SafeSprintf(this->execErrorBuffer,0x10000,
                         "ERROR: there is no breakpoint at instruction %d",(ulong)instruction);
      this->execErrorMessage = this->execErrorBuffer;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExecutorRegVm::RemoveBreakpoint(unsigned instruction)
{
	if(instruction > exLinker->exRegVmCode.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	if(exLinker->exRegVmCode[instruction].code != rviNop)
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: there is no breakpoint at instruction %d", instruction);
		execErrorMessage = execErrorBuffer;
		return false;
	}

	exLinker->exRegVmCode[instruction] = breakCode[exLinker->exRegVmCode[instruction].argument];
	return true;
}